

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  longdouble *plVar1;
  _Head_base<0UL,_long_double_*,_false> _Var2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  int iVar3;
  undefined8 uVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  int *piVar11;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
  _Var12;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_false>
  _Var13;
  col_value cVar14;
  undefined8 extraout_RAX;
  int iVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  int iVar17;
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> _Var18;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var19;
  row_value *prVar20;
  long lVar21;
  type it;
  rc_data *__last;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  longdouble in_ST0;
  longdouble lVar27;
  longdouble in_ST1;
  longdouble lVar28;
  longdouble lVar29;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar30;
  double dVar31;
  undefined1 local_a8 [16];
  _Head_base<0UL,_int_*,_false> local_98;
  int local_8c;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_88;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
  *local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_78;
  long local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_68;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  long local_58;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  longdouble local_3c;
  
  local_3c = theta;
  piVar11 = (first->current)._M_current;
  if (piVar11 != (last->current)._M_current) {
    local_80 = this + 8;
    lVar28 = kappa / ((longdouble)1 - kappa);
    lVar30 = in_ST4;
    local_78._M_head_impl = (col_value *)this;
    local_68 = first;
    local_60 = last;
    do {
      _Var18.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)(long)piVar11[-1];
      if (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
            *)this)->m <= piVar11[-1]) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        goto LAB_001c3da5;
      }
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a8,(int)local_80);
      _Var19._M_head_impl = (row_value *)0x0;
      local_98._M_head_impl =
           (int *)_Var18.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (local_a8._8_8_ != local_a8._0_8_) {
        _Var2._M_head_impl =
             (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                *)this)->P)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        _Var16._M_head_impl = (int *)local_a8._8_8_;
        do {
          iVar24 = *_Var16._M_head_impl;
          _Var16._M_head_impl = _Var16._M_head_impl + 8;
          _Var2._M_head_impl[iVar24] = _Var2._M_head_impl[iVar24] * local_3c;
        } while (_Var16._M_head_impl != (int *)local_a8._0_8_);
        _Var19._M_head_impl = (row_value *)0x0;
        if (local_a8._8_8_ != local_a8._0_8_) {
          _Var19._M_head_impl = (row_value *)0x0;
          piVar11 = (int *)local_a8._8_8_;
          lVar27 = in_ST0;
          lVar29 = in_ST1;
          lVar5 = in_ST2;
          lVar6 = in_ST3;
          lVar7 = in_ST4;
          uVar8 = 1;
          do {
            uVar10 = uVar8;
            in_ST4 = lVar30;
            in_ST3 = lVar7;
            in_ST2 = lVar6;
            in_ST1 = lVar5;
            in_ST0 = lVar29;
            prVar20 = _Var19._M_head_impl;
            lVar30 = in_ST4;
            sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,(int)local_80);
            _Var16._M_head_impl =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            lVar29 = (longdouble)0;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_48._M_head_impl
                != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              lVar29 = (longdouble)0;
              do {
                iVar24 = *local_48._M_head_impl;
                local_48._M_head_impl = local_48._M_head_impl + 2;
                local_8c = _Var16._M_head_impl[iVar24];
                lVar29 = (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                            *)this)->P)._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl[iVar24] *
                         (longdouble)local_8c + lVar29;
                lVar30 = in_ST4;
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_48._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
            }
            _Var12._M_head_impl =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
                 ._M_head_impl;
            (((bit_array *)((long)(_Var12._M_head_impl + (long)prVar20) + 0x10))->
            super_bit_array_impl).m_size = (int)prVar20;
            (((bit_array *)((long)(_Var12._M_head_impl + (long)prVar20) + 0x14))->
            super_bit_array_impl).m_size = _Var16._M_head_impl[*piVar11];
            quadratic_cost_type<long_double>::operator()
                      ((longdouble *)
                       ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                         *)this)->c,
                       (quadratic_cost_type<long_double> *)(ulong)*(uint *)(local_a8._8_8_ + 4),
                       (int)x,(bit_array *)_Var12._M_head_impl);
            _Var12._M_head_impl =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
                 ._M_head_impl;
            piVar11 = piVar11 + 2;
            _Var12._M_head_impl[(long)prVar20].value = lVar27 - lVar29;
            _Var19._M_head_impl = (row_value *)((long)&prVar20->value + 1);
            lVar27 = in_ST0;
            lVar29 = in_ST1;
            lVar5 = in_ST2;
            lVar6 = in_ST3;
            lVar7 = in_ST4;
            uVar8 = uVar10 + 1;
          } while (piVar11 != (int *)local_a8._0_8_);
          if (prVar20 != (row_value *)0x0) {
            __g = ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var12._M_head_impl,
                       _Var12._M_head_impl + ((ulong)_Var19._M_head_impl & 0xffffffff),
                       (int)LZCOUNT((ulong)_Var19._M_head_impl & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var12._M_head_impl,
                       _Var12._M_head_impl + ((ulong)_Var19._M_head_impl & 0xffffffff));
            __last = _Var12._M_head_impl + 1;
            lVar25 = (ulong)uVar10 * 0x20 + -0x20;
            do {
              if (((_Var12._M_head_impl)->value != __last->value) ||
                 (NAN((_Var12._M_head_impl)->value) || NAN(__last->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var12._M_head_impl,__last,__g);
                _Var12._M_head_impl = __last;
              }
              __last = __last + 1;
              lVar25 = lVar25 + -0x20;
            } while (lVar25 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var12._M_head_impl,__last,__g);
          }
        }
      }
      iVar24 = 0;
      _Var13._M_head_impl =
           (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor_*,_false>
           ._M_head_impl;
      local_70 = (long)local_98._M_head_impl * 3;
      if (_Var13._M_head_impl[(long)local_98._M_head_impl].min < 1) {
        lVar25 = 0xffffffff;
LAB_001c3b8e:
        iVar3 = (int)lVar25;
        iVar15 = iVar3 + 1;
        iVar17 = (int)_Var19._M_head_impl;
        if ((iVar15 < iVar17) && (iVar24 <= (&(_Var13._M_head_impl)->max)[local_70])) {
          cVar14 = *(col_value *)((long)this + 0x50);
          lVar21 = (long)iVar3 << 5;
          lVar23 = (long)iVar3 + 1;
          do {
            lVar25 = lVar23;
            iVar24 = iVar24 + *(int *)((long)cVar14 + 0x34 + lVar21);
            if (iVar24 < *(int *)((long)*(col_value *)((long)this + 0x58) + local_70 * 4)) {
              piVar11 = (int *)(local_a8._8_8_ +
                               (long)*(int *)((long)cVar14 + 0x30 + lVar21) * 2 * 4);
LAB_001c3c86:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar11[1]);
              *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar11 * 0x10) =
                   *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar11 * 0x10)
                   - (delta + lVar28 * *(longdouble *)
                                        ((long)*(col_value *)((long)this + 0x50) + 0x20 + lVar21) *
                                       (longdouble)0.5);
              break;
            }
            piVar11 = (int *)(local_a8._8_8_ + (long)*(int *)((long)cVar14 + 0x30 + lVar21) * 2 * 4)
            ;
            if (*(int *)((long)*(col_value *)((long)this + 0x58) + local_70 * 4 + 4) < iVar24)
            goto LAB_001c3c86;
            lVar27 = *(longdouble *)((long)cVar14 + 0x20 + lVar21);
            lVar29 = (longdouble)0;
            bVar9 = lVar27 == lVar29;
            bVar26 = lVar27 < lVar29;
            if ((bVar9) && (!NAN(lVar27) && !NAN(lVar29))) {
              dVar31 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)*(col_value *)this);
              bVar9 = dVar31 == 0.5;
              bVar26 = 0.5 < dVar31;
            }
            if (bVar26 || bVar9) goto LAB_001c3c86;
            bit_array_impl::set(&x->super_bit_array_impl,piVar11[1]);
            cVar14 = *(col_value *)((long)this + 0x50);
            plVar1 = (longdouble *)((long)cVar14 + 0x20 + lVar21);
            lVar21 = lVar21 + 0x20;
            *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar11 * 0x10) =
                 *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar11 * 0x10) +
                 delta + lVar28 * *plVar1 * (longdouble)0.5;
            lVar23 = lVar25 + 1;
          } while (lVar25 + 1 < (long)iVar17);
          iVar15 = (int)lVar25 + 1;
        }
      }
      else {
        _Var12._M_head_impl =
             (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar21 = 0;
        iVar24 = 0;
        local_58 = (long)(int)_Var19._M_head_impl + -2;
        lVar23 = -1;
        local_88._M_head_impl = _Var19._M_head_impl;
        do {
          uVar4 = local_a8._8_8_;
          lVar22 = (long)*(int *)((long)&(_Var12._M_head_impl)->id + lVar21);
          iVar24 = iVar24 + *(int *)((long)&(_Var12._M_head_impl)->a + lVar21);
          lVar25 = lVar23 + 1;
          iVar17 = *(int *)((long)*(col_value *)((long)this + 0x58) + local_70 * 4);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_a8._8_8_ + (lVar22 * 2 + 1) * 4));
          _Var12._M_head_impl = *(rc_data **)((long)local_78._M_head_impl + 0x50);
          *(longdouble *)
           (*(long *)((long)local_78._M_head_impl + 0x68) +
           (long)*(int *)(uVar4 + lVar22 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)((long)local_78._M_head_impl + 0x68) +
                (long)*(int *)(uVar4 + lVar22 * 2 * 4) * 0x10) +
               lVar28 * *(longdouble *)((long)&(_Var12._M_head_impl)->value + lVar21) *
                        (longdouble)0.5 + delta;
          this = (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                  *)local_78;
          if (iVar17 <= iVar24) break;
          lVar21 = lVar21 + 0x20;
          bVar9 = lVar23 < local_58;
          lVar23 = lVar25;
        } while (bVar9);
        _Var13._M_head_impl = *(bound_factor **)((long)local_78._M_head_impl + 0x58);
        _Var19._M_head_impl = local_88._M_head_impl;
        lVar30 = in_ST4;
        if ((&(_Var13._M_head_impl)->min)[local_70] <= iVar24) goto LAB_001c3b8e;
        iVar17 = (int)local_88._M_head_impl;
        iVar15 = (int)lVar25 + 1;
      }
      this = (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
              *)local_78._M_head_impl;
      if (iVar15 < iVar17) {
        cVar14 = local_78._M_head_impl[10];
        lVar23 = (long)(int)(uint)lVar25 << 5;
        iVar17 = ~(uint)lVar25 + iVar17;
        do {
          uVar4 = local_a8._8_8_;
          lVar25 = (long)*(int *)((long)cVar14 + 0x30 + lVar23);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_a8._8_8_ + (lVar25 * 2 + 1) * 4));
          cVar14 = *(col_value *)((long)this + 0x50);
          plVar1 = (longdouble *)((long)cVar14 + 0x20 + lVar23);
          lVar23 = lVar23 + 0x20;
          iVar17 = iVar17 + -1;
          *(longdouble *)
           ((long)*(col_value *)((long)this + 0x68) + (long)*(int *)(uVar4 + lVar25 * 2 * 4) * 0x10)
               = *(longdouble *)
                  ((long)*(col_value *)((long)this + 0x68) +
                  (long)*(int *)(uVar4 + lVar25 * 2 * 4) * 0x10) -
                 (delta + *plVar1 * (longdouble)0.5 * lVar28);
          lVar30 = in_ST4;
        } while (iVar17 != 0);
      }
      bVar9 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                          *)this,(int)local_98._M_head_impl,x);
      if (!bVar9) {
LAB_001c3da5:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      piVar11 = (local_68->current)._M_current + -1;
      (local_68->current)._M_current = piVar11;
    } while (piVar11 != (local_60->current)._M_current);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }